

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_2::PtexUtils::blend
               (void *src,float weight,void *dst,bool flip,int rowlen,DataType dt,int nchan)

{
  short *psVar1;
  void *pvVar2;
  float fVar3;
  uint16_t uVar4;
  byte *pbVar5;
  void *pvVar6;
  int iVar7;
  undefined7 in_register_00000011;
  long lVar8;
  long lVar9;
  char *pcVar10;
  
  switch((int)CONCAT71(in_register_00000011,flip) + dt * 2) {
  case dt_uint8:
    if (nchan * rowlen != 0) {
      lVar8 = 0;
      do {
        *(char *)((long)dst + lVar8) =
             *(char *)((long)dst + lVar8) +
             (char)(int)((float)*(byte *)((long)src + lVar8) * weight);
        lVar8 = lVar8 + 1;
      } while (nchan * rowlen != lVar8);
    }
    break;
  case dt_uint16:
    if (nchan * rowlen != 0) {
      pbVar5 = (byte *)((long)(nchan * rowlen) + (long)src);
      pcVar10 = (char *)((long)dst + (long)((rowlen + -1) * nchan));
      do {
        iVar7 = nchan;
        if (0 < nchan) {
          do {
            *pcVar10 = *pcVar10 + (char)(int)((float)*src * weight);
            src = (void *)((long)src + 1);
            pcVar10 = pcVar10 + 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        pcVar10 = pcVar10 + -(long)(nchan * 2);
      } while ((byte *)src != pbVar5);
    }
    break;
  case dt_half:
    if (nchan * rowlen != 0) {
      lVar8 = 0;
      do {
        *(short *)((long)dst + lVar8) =
             *(short *)((long)dst + lVar8) +
             (short)(int)((float)*(ushort *)((long)src + lVar8) * weight);
        lVar8 = lVar8 + 2;
      } while ((long)(nchan * rowlen) * 2 != lVar8);
    }
    break;
  case dt_float:
    if (nchan * rowlen != 0) {
      pvVar2 = (void *)((long)src + (long)(nchan * rowlen) * 2);
      pvVar6 = (void *)((long)dst + (long)((rowlen + -1) * nchan) * 2);
      do {
        if (0 < nchan) {
          lVar8 = 0;
          lVar9 = 0;
          do {
            psVar1 = (short *)((long)pvVar6 + lVar9 * 2);
            *psVar1 = *psVar1 + (short)(int)((float)*(ushort *)((long)src + lVar9 * 2) * weight);
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + -2;
          } while (nchan != (int)lVar9);
          src = (void *)((long)src - lVar8);
          pvVar6 = (void *)((long)pvVar6 - lVar8);
        }
        pvVar6 = (void *)((long)pvVar6 + (long)(nchan * 2) * -2);
      } while (src != pvVar2);
    }
    break;
  case 4:
    if (nchan * rowlen != 0) {
      lVar8 = 0;
      do {
        fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)dst + lVar8) * 4);
        uVar4 = PtexHalf::fromFloat(*(float *)(PtexHalf::h2fTable +
                                              (ulong)*(ushort *)((long)src + lVar8) * 4) * weight);
        uVar4 = PtexHalf::fromFloat(fVar3 + *(float *)(PtexHalf::h2fTable + (ulong)uVar4 * 4));
        *(uint16_t *)((long)dst + lVar8) = uVar4;
        lVar8 = lVar8 + 2;
      } while ((long)(nchan * rowlen) * 2 != lVar8);
    }
    break;
  case 5:
    if (nchan * rowlen != 0) {
      pvVar2 = (void *)((long)src + (long)(nchan * rowlen) * 2);
      pvVar6 = (void *)((long)dst + (long)((rowlen + -1) * nchan) * 2);
      do {
        if (0 < nchan) {
          lVar8 = 0;
          lVar9 = 0;
          do {
            fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)pvVar6 + lVar9 * 2) * 4
                              );
            uVar4 = PtexHalf::fromFloat(*(float *)(PtexHalf::h2fTable +
                                                  (ulong)*(ushort *)((long)src + lVar9 * 2) * 4) *
                                        weight);
            uVar4 = PtexHalf::fromFloat(fVar3 + *(float *)(PtexHalf::h2fTable + (ulong)uVar4 * 4));
            *(uint16_t *)((long)pvVar6 + lVar9 * 2) = uVar4;
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + -2;
          } while (nchan != (int)lVar9);
          src = (void *)((long)src - lVar8);
          pvVar6 = (void *)((long)pvVar6 - lVar8);
        }
        pvVar6 = (void *)((long)pvVar6 + (long)(nchan * 2) * -2);
      } while (src != pvVar2);
    }
    break;
  case 6:
    if (nchan * rowlen != 0) {
      lVar8 = 0;
      do {
        *(float *)((long)dst + lVar8) =
             *(float *)((long)src + lVar8) * weight + *(float *)((long)dst + lVar8);
        lVar8 = lVar8 + 4;
      } while ((long)(nchan * rowlen) * 4 != lVar8);
    }
    break;
  case 7:
    if (nchan * rowlen != 0) {
      pvVar2 = (void *)((long)src + (long)(nchan * rowlen) * 4);
      pvVar6 = (void *)((long)dst + (long)((rowlen + -1) * nchan) * 4);
      do {
        if (0 < nchan) {
          lVar8 = 0;
          lVar9 = 0;
          do {
            *(float *)((long)pvVar6 + lVar9 * 4) =
                 *(float *)((long)src + lVar9 * 4) * weight + *(float *)((long)pvVar6 + lVar9 * 4);
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + -4;
          } while (nchan != (int)lVar9);
          src = (void *)((long)src - lVar8);
          pvVar6 = (void *)((long)pvVar6 - lVar8);
        }
        pvVar6 = (void *)((long)pvVar6 + (long)(nchan * 2) * -4);
      } while (src != pvVar2);
    }
  }
  return;
}

Assistant:

void blend(const void* src, float weight, void* dst, bool flip,
           int rowlen, DataType dt, int nchan)
{
    switch ((dt<<1) | int(flip)) {
    case (dt_uint8<<1):        blend(static_cast<const uint8_t*>(src), weight,
                                     static_cast<uint8_t*>(dst), rowlen, nchan); break;
    case (dt_uint8<<1 | 1):    blendflip(static_cast<const uint8_t*>(src), weight,
                                         static_cast<uint8_t*>(dst), rowlen, nchan); break;
    case (dt_half<<1):         blend(static_cast<const PtexHalf*>(src), weight,
                                     static_cast<PtexHalf*>(dst), rowlen, nchan); break;
    case (dt_half<<1 | 1):     blendflip(static_cast<const PtexHalf*>(src), weight,
                                         static_cast<PtexHalf*>(dst), rowlen, nchan); break;
    case (dt_uint16<<1):       blend(static_cast<const uint16_t*>(src), weight,
                                     static_cast<uint16_t*>(dst), rowlen, nchan); break;
    case (dt_uint16<<1 | 1):   blendflip(static_cast<const uint16_t*>(src), weight,
                                         static_cast<uint16_t*>(dst), rowlen, nchan); break;
    case (dt_float<<1):        blend(static_cast<const float*>(src), weight,
                                     static_cast<float*>(dst), rowlen, nchan); break;
    case (dt_float<<1 | 1):    blendflip(static_cast<const float*>(src), weight,
                                         static_cast<float*>(dst), rowlen, nchan); break;
    }
}